

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoTuplesRollingN.h
# Opt level: O2

void __thiscall
chrono::
ChConstraintTwoTuplesRollingN<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
::Project(ChConstraintTwoTuplesRollingN<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
          *this)

{
  float fVar1;
  double dVar2;
  double dVar3;
  ChConstraintTwoTuplesRollingT<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  *pCVar4;
  ChConstraintTwoTuplesRollingT<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  *pCVar5;
  ChConstraintTwoTuplesContactN<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  *pCVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  
  pCVar4 = this->constraint_U;
  if (((pCVar4 != (ChConstraintTwoTuplesRollingT<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
                   *)0x0) &&
      (pCVar5 = this->constraint_V,
      pCVar5 != (ChConstraintTwoTuplesRollingT<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
                 *)0x0)) &&
     (pCVar6 = this->constraint_N,
     pCVar6 != (ChConstraintTwoTuplesContactN<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
                *)0x0)) {
    fVar1 = this->spinningfriction;
    dVar11 = (pCVar6->
             super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
             ).super_ChConstraint.l_i;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar11;
    dVar2 = (pCVar4->
            super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
            ).super_ChConstraint.l_i;
    dVar3 = (pCVar5->
            super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
            ).super_ChConstraint.l_i;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar3;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      dVar14 = (this->
               super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
               ).super_ChConstraint.l_i;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = dVar14;
      auVar18._0_8_ = (double)fVar1;
      auVar18._8_8_ = 0;
      auVar9._8_8_ = 0x7fffffffffffffff;
      auVar9._0_8_ = 0x7fffffffffffffff;
      auVar9 = vandpd_avx512vl(auVar10,auVar9);
      dVar17 = auVar9._0_8_;
      if (dVar11 * auVar18._0_8_ <= dVar17) {
        auVar7._8_8_ = 0x7fffffffffffffff;
        auVar7._0_8_ = 0x7fffffffffffffff;
        auVar10 = vandpd_avx512vl(auVar12,auVar7);
        dVar19 = 0.0;
        if (auVar10._0_8_ < 1e-14) {
          dVar20 = 0.0;
        }
        else {
          dVar20 = 0.0;
          if ((-1.0 / auVar18._0_8_) * dVar11 <= dVar17) {
            auVar10 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),ZEXT416(0x3f800000))
            ;
            auVar9 = vfmadd213sd_fma(auVar18,auVar9,auVar12);
            dVar19 = auVar9._0_8_ / (double)auVar10._0_4_;
            dVar20 = dVar14 * ((dVar19 * auVar18._0_8_) / dVar17);
          }
        }
        (pCVar6->
        super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
        ).super_ChConstraint.l_i = dVar19;
        (this->
        super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
        ).super_ChConstraint.l_i = dVar20;
      }
    }
    fVar1 = this->rollingfriction;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      auVar16._0_8_ = (double)fVar1;
      auVar16._8_8_ = 0;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = dVar2 * dVar2;
      auVar13 = vfmadd231sd_fma(auVar15,auVar13,auVar13);
      auVar13 = vsqrtsd_avx(auVar13,auVar13);
      dVar14 = auVar13._0_8_;
      if (dVar11 * auVar16._0_8_ <= dVar14) {
        auVar8._8_8_ = 0x7fffffffffffffff;
        auVar8._0_8_ = 0x7fffffffffffffff;
        auVar9 = vandpd_avx512vl(auVar12,auVar8);
        if ((auVar9._0_8_ < 1e-14) || (dVar14 < dVar11 * (-1.0 / auVar16._0_8_))) {
          (pCVar6->
          super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
          ).super_ChConstraint.l_i = 0.0;
          (pCVar4->
          super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
          ).super_ChConstraint.l_i = 0.0;
          (pCVar5->
          super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
          ).super_ChConstraint.l_i = 0.0;
          return;
        }
        auVar9 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),ZEXT416(0x3f800000));
        auVar12 = vfmadd231sd_fma(auVar12,auVar13,auVar16);
        dVar11 = auVar12._0_8_ / (double)auVar9._0_4_;
        (pCVar6->
        super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
        ).super_ChConstraint.l_i = dVar11;
        dVar14 = (dVar11 * auVar16._0_8_) / dVar14;
        (pCVar4->
        super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
        ).super_ChConstraint.l_i = dVar2 * dVar14;
        (pCVar5->
        super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
        ).super_ChConstraint.l_i = dVar3 * dVar14;
      }
    }
    else {
      (pCVar4->
      super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
      ).super_ChConstraint.l_i = 0.0;
      (pCVar5->
      super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
      ).super_ChConstraint.l_i = 0.0;
      if (dVar11 < 0.0) {
        (pCVar6->
        super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
        ).super_ChConstraint.l_i = 0.0;
        return;
      }
    }
  }
  return;
}

Assistant:

virtual void Project() override {
        if (!constraint_U)
            return;

        if (!constraint_V)
            return;

        if (!constraint_N)
            return;

        // METHOD
        // Anitescu-Tasora projection on rolling-friction cone generator and polar cone
        // (contractive, but performs correction on three components: normal,u,v)

        double f_n = constraint_N->Get_l_i();
        double t_n = this->Get_l_i();
        double t_u = constraint_U->Get_l_i();
        double t_v = constraint_V->Get_l_i();
        double t_tang = sqrt(t_v * t_v + t_u * t_u);
        double t_sptang = fabs(t_n);  // = sqrt(t_n*t_n);

        // A. Project the spinning friction (approximate - should do cone
        //   projection stuff as in B, but spinning friction is usually very low...)

        if (spinningfriction) {
            if (t_sptang < spinningfriction * f_n) {
                // inside upper cone? keep untouched!
            } else {
                // inside lower cone? reset  normal,u,v to zero!
                if ((t_sptang < -(1.0 / spinningfriction) * f_n) || (fabs(f_n) < 10e-15)) {
                    constraint_N->Set_l_i(0);
                    this->Set_l_i(0);
                } else {
                    // remaining case: project orthogonally to generator segment of upper cone (CAN BE simplified)
                    double f_n_proj = (t_sptang * spinningfriction + f_n) / (spinningfriction * spinningfriction + 1);
                    double t_tang_proj = f_n_proj * spinningfriction;
                    double tproj_div_t = t_tang_proj / t_sptang;
                    double t_n_proj = tproj_div_t * t_n;

                    constraint_N->Set_l_i(f_n_proj);
                    this->Set_l_i(t_n_proj);
                }
            }
        }

        // B. Project the rolling friction

        // shortcut
        if (!rollingfriction) {
            constraint_U->Set_l_i(0);
            constraint_V->Set_l_i(0);
            if (f_n < 0)
                constraint_N->Set_l_i(0);
            return;
        }

        // inside upper cone? keep untouched!
        if (t_tang < rollingfriction * f_n)
            return;

        // inside lower cone? reset  normal,u,v to zero!
        if ((t_tang < -(1.0 / rollingfriction) * f_n) || (fabs(f_n) < 10e-15)) {
            double f_n_proj = 0;
            double t_u_proj = 0;
            double t_v_proj = 0;

            constraint_N->Set_l_i(f_n_proj);
            constraint_U->Set_l_i(t_u_proj);
            constraint_V->Set_l_i(t_v_proj);

            return;
        }

        // remaining case: project orthogonally to generator segment of upper cone
        double f_n_proj = (t_tang * rollingfriction + f_n) / (rollingfriction * rollingfriction + 1);
        double t_tang_proj = f_n_proj * rollingfriction;
        double tproj_div_t = t_tang_proj / t_tang;
        double t_u_proj = tproj_div_t * t_u;
        double t_v_proj = tproj_div_t * t_v;

        constraint_N->Set_l_i(f_n_proj);
        constraint_U->Set_l_i(t_u_proj);
        constraint_V->Set_l_i(t_v_proj);
    }